

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_RemovePeginWitnessStackAll_Test::TestBody
          (ConfidentialTxIn_RemovePeginWitnessStackAll_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_258;
  Message local_250;
  ByteData256 local_248;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8;
  int local_1f0;
  uint32_t local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  Message local_1d0 [2];
  undefined1 local_1c0 [8];
  ConfidentialTxIn txin;
  undefined1 local_50 [8];
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ConfidentialTxIn_RemovePeginWitnessStackAll_Test *this_local;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_1c0,&exp_txid,2,0xfffffffe,&exp_script,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&exp_blinding_nonce,&exp_asset_entropy,
             &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
             &exp_inflation_keys_rangeproof,(ScriptWitness *)local_50);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::RemovePeginWitnessStackAll((ConfidentialTxIn *)local_1c0);
    }
  }
  else {
    testing::Message::Message(local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xdd,
               "Expected: (txin.RemovePeginWitnessStackAll()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_1d0);
  }
  local_1ec = cfd::core::ConfidentialTxIn::GetPeginWitnessStackNum((ConfidentialTxIn *)local_1c0);
  local_1f0 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1e8,"txin.GetPeginWitnessStackNum()","0",&local_1ec,&local_1f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  cfd::core::ConfidentialTxIn::GetWitnessHash(&local_248,(ConfidentialTxIn *)local_1c0);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_230,&local_248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txin.GetWitnessHash().GetHex().c_str()",
             "\"17f0c9b759a09c56116151cca94f18340acc3a782b2062cee3c41333b2dc63fe\"",pcVar2,
             "17f0c9b759a09c56116151cca94f18340acc3a782b2062cee3c41333b2dc63fe");
  std::__cxx11::string::~string((string *)&local_230);
  cfd::core::ByteData256::~ByteData256(&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_1c0);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_50);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxIn, RemovePeginWitnessStackAll) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.RemovePeginWitnessStackAll()));
  EXPECT_EQ(txin.GetPeginWitnessStackNum(), 0);
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "17f0c9b759a09c56116151cca94f18340acc3a782b2062cee3c41333b2dc63fe");
}